

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

float __thiscall QByteArray::toFloat(QByteArray *this,bool *ok)

{
  float fVar1;
  double d;
  
  d = toDouble(this,ok);
  fVar1 = QLocaleData::convertDoubleToFloat(d,ok);
  return fVar1;
}

Assistant:

float QByteArray::toFloat(bool *ok) const
{
    return QLocaleData::convertDoubleToFloat(toDouble(ok), ok);
}